

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O1

vec4 __thiscall vera::Triangle::getClosestRGBSignedDistance(Triangle *this,vec3 *_p)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 aVar4;
  undefined4 extraout_XMM0_Db;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar6;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar7;
  float fVar8;
  float fVar9;
  vec3 vVar10;
  vec3 vVar11;
  vec4 vVar12;
  vec3 local_68;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  vec3 local_28;
  
  local_28.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  local_28.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  local_28.field_2.z = 0.0;
  vVar10 = getClosestPoint(this,_p);
  local_28._0_8_ = vVar10._0_8_;
  local_28.field_2 = vVar10.field_2;
  vVar11 = getBarycentricOf(this,&local_28);
  local_68.field_2 = vVar11.field_2;
  local_68._0_8_ = vVar11._0_8_;
  vVar12 = getColor(this,&local_68);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = vVar12._0_8_;
  local_38._12_4_ = extraout_XMM0_Dd;
  fVar2 = (_p->field_0).x - local_28.field_0.x;
  fVar7 = (_p->field_1).y - local_28.field_1.y;
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = vVar12._8_8_;
  local_48._12_4_ = in_XMM1_Dd;
  fVar8 = (_p->field_2).z - vVar10.field_2.z;
  fVar9 = fVar8 * fVar8 + fVar7 * fVar7 + fVar2 * fVar2;
  uStack_54 = 0;
  uStack_50 = 0;
  uStack_4c = 0;
  fVar3 = SQRT(fVar9);
  local_58 = fVar3;
  if (fVar9 < 0.0) {
    local_58 = sqrtf(fVar9);
    uStack_54 = extraout_XMM0_Db;
    uStack_50 = extraout_XMM0_Dc_00;
    uStack_4c = extraout_XMM0_Dd_00;
  }
  vVar10 = getNormal(this,&local_68);
  aVar6 = vVar10.field_2;
  aVar4 = vVar10.field_0;
  aVar5 = vVar10.field_1;
  if (fVar9 < 0.0) {
    fVar3 = sqrtf(fVar9);
  }
  fVar3 = 1.0 / fVar3;
  fVar9 = aVar6.z * aVar6.z + aVar5.y * aVar5.y + aVar4.x * aVar4.x;
  if (fVar9 < 0.0) {
    fVar9 = sqrtf(fVar9);
  }
  else {
    fVar9 = SQRT(fVar9);
  }
  fVar9 = 1.0 / fVar9;
  uVar1 = -(uint)(0.0 <= fVar8 * fVar3 * aVar6.z * fVar9 +
                         fVar7 * fVar3 * aVar5.y * fVar9 + fVar2 * fVar3 * aVar4.x * fVar9);
  vVar12.field_3 =
       (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)
       (~uVar1 & (uint)-local_58 | (uint)local_58 & uVar1);
  vVar12.field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)local_48._0_4_;
  vVar12.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)local_38._0_4_;
  vVar12.field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)local_38._4_4_;
  return vVar12;
}

Assistant:

glm::vec4 Triangle::getClosestRGBSignedDistance(const glm::vec3& _p) const {
    glm::vec3 nearest = glm::vec3(0.0);
    glm::vec3 pseudo_normal = getNormal();

    nearest = getClosestPoint(_p);

    glm::vec3 barycentric = getBarycentricOf(nearest);
    glm::vec4 c = getColor( barycentric );

    glm::vec3 u = _p - nearest;
    c.a = glm::length(u);
    // c.a = unsignedDistance(_p);

    pseudo_normal = getNormal( barycentric );

    c.a = (glm::dot( glm::normalize(u), glm::normalize(pseudo_normal) ) >= 0.0)? c.a : -c.a; 
    // c.a *= glm::sign( glm::dot(_p, m_normal) - glm::dot(m_vertices[0], m_normal) );

    return c;
}